

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

__pid_t __thiscall
kj::Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::wait
          (Promise<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
           *this,void *__stat_loc)

{
  WaitScope *in_RDX;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_> result;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
  local_1b0;
  
  local_1b0.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_1b0.value.ptr.isSet = false;
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_1b0.super_ExceptionOrValue,in_RDX);
  if (local_1b0.value.ptr.isSet == true) {
    if (local_1b0.super_ExceptionOrValue.exception.ptr.isSet != false) {
      throwRecoverableException(&local_1b0.super_ExceptionOrValue.exception.ptr.field_1.value,0);
    }
    this[2].super_PromiseBase.node.disposer = (Disposer *)local_1b0.value.ptr.field_1._32_8_;
    this[2].super_PromiseBase.node.ptr = (PromiseNode *)local_1b0.value.ptr.field_1._40_8_;
    this[1].super_PromiseBase.node.disposer =
         (Disposer *)local_1b0.value.ptr.field_1.value.super_Reader._reader.data;
    this[1].super_PromiseBase.node.ptr =
         (PromiseNode *)local_1b0.value.ptr.field_1.value.super_Reader._reader.pointers;
    (this->super_PromiseBase).node.disposer =
         (Disposer *)local_1b0.value.ptr.field_1.value.super_Reader._reader.segment;
    (this->super_PromiseBase).node.ptr =
         (PromiseNode *)local_1b0.value.ptr.field_1.value.super_Reader._reader.capTable;
    this[3].super_PromiseBase.node.disposer = local_1b0.value.ptr.field_1.value.hook.disposer;
    this[3].super_PromiseBase.node.ptr = (PromiseNode *)local_1b0.value.ptr.field_1.value.hook.ptr;
    local_1b0.value.ptr.field_1.value.hook.ptr = (ResponseHook *)0x0;
    kj::_::
    ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::
    ~ExceptionOr(&local_1b0);
    return (__pid_t)this;
  }
  if (local_1b0.super_ExceptionOrValue.exception.ptr.isSet != false) {
    throwFatalException(&local_1b0.super_ExceptionOrValue.exception.ptr.field_1.value,0);
  }
  kj::_::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }